

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

QArrayDataPointer<const_QMetaObject_*> *
QArrayDataPointer<const_QMetaObject_*>::allocateGrow
          (QArrayDataPointer<const_QMetaObject_*> *from,qsizetype n,GrowthPosition position)

{
  ArrayOptions AVar1;
  QArrayDataPointer<const_QMetaObject_*> *pQVar2;
  type *ppQVar3;
  type *pppQVar4;
  Promoted<int,_long_long> PVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<const_QMetaObject_*> *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  bool valid;
  type *dataPtr;
  type *header;
  bool grows;
  qsizetype capacity;
  qsizetype minimalCapacity;
  QArrayDataPointer<const_QMetaObject_*> *in_stack_ffffffffffffff40;
  QArrayDataPointer<const_QMetaObject_*> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  long local_30;
  int local_24;
  pair<QTypedArrayData<const_QMetaObject_*>_*,_const_QMetaObject_**> local_20;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = constAllocatedCapacity(in_stack_ffffffffffffff40);
  qMax<long_long>((longlong *)(in_RSI + 0x10),&local_10);
  if (in_ECX == 0) {
    freeSpaceAtEnd(in_stack_ffffffffffffff48);
  }
  else {
    freeSpaceAtBegin(in_stack_ffffffffffffff48);
  }
  pQVar2 = (QArrayDataPointer<const_QMetaObject_*> *)
           detachCapacity((QArrayDataPointer<const_QMetaObject_*> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (qsizetype)in_stack_ffffffffffffff48);
  constAllocatedCapacity(in_stack_ffffffffffffff40);
  local_20.second = (QMetaObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.first = (QTypedArrayData<const_QMetaObject_*> *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QTypedArrayData<const_QMetaObject_*>::allocate
                       (CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        (AllocationOption)((ulong)pQVar2 >> 0x20));
  ppQVar3 = std::get<0ul,QTypedArrayData<QMetaObject_const*>*,QMetaObject_const**>
                      ((pair<QTypedArrayData<const_QMetaObject_*>_*,_const_QMetaObject_**> *)
                       0x38267d);
  pppQVar4 = std::get<1ul,QTypedArrayData<QMetaObject_const*>*,QMetaObject_const**>
                       ((pair<QTypedArrayData<const_QMetaObject_*>_*,_const_QMetaObject_**> *)
                        0x38269e);
  bVar6 = false;
  if (*ppQVar3 != (type)0x0) {
    bVar6 = *pppQVar4 != (type)0x0;
  }
  if (bVar6) {
    if (in_ECX == 1) {
      local_24 = 0;
      local_30 = ((((*ppQVar3)->super_QArrayData).alloc - *(long *)(in_RSI + 0x10)) - in_RDX) / 2;
      PVar5 = qMax<int,long_long>(&local_24,&local_30);
      pQVar2 = (QArrayDataPointer<const_QMetaObject_*> *)(in_RDX + PVar5);
    }
    else {
      pQVar2 = (QArrayDataPointer<const_QMetaObject_*> *)freeSpaceAtBegin(pQVar2);
    }
    *pppQVar4 = *pppQVar4 + (long)pQVar2;
    AVar1 = flags(pQVar2);
    ((*ppQVar3)->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (Int)AVar1.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    QArrayDataPointer(in_RDI,*ppQVar3,*pppQVar4,0);
  }
  else {
    QArrayDataPointer(in_RDI,*ppQVar3,*pppQVar4,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }